

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_helper.h
# Opt level: O1

date_time date::calendar_helper::from_seconds_count(seconds_count seconds)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  
  lVar7 = (seconds / 0x15180) * 100;
  uVar9 = lVar7 + 0x776f;
  lVar5 = uVar9 / 0x37bb49 - uVar9 / 0xdeed24;
  uVar8 = (lVar5 * 100 + lVar7 + 0x776fU) / 0x8ead;
  uVar9 = uVar8 & 0xffff;
  lVar5 = ((uVar9 * -0x16d + seconds / 0x15180 + lVar5) - (uVar9 >> 2)) + 0x132;
  uVar9 = lVar5 * 5 + 0x1c8;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (uVar9 / 0x99) * 0x99 - 0x1c9;
  uVar4 = (uint)(uVar9 / 0x99);
  uVar10 = uVar4 + 0xf4;
  if (uVar9 < 0x7c5) {
    uVar10 = uVar4;
  }
  uVar6 = seconds % 0x15180 >> 4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6;
  uVar6 = (uVar6 / 0xe1) * -0xe10 + seconds % 0x15180;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar6;
  return (date_time)
         ((ulong)(((int)uVar8 + 1) - (uint)(uVar9 < 0x7c5) & 0xffff) |
          (ulong)(SUB164(auVar2 * ZEXT816(0x91a2b3c4d5e6f81),8) & 0x7f8) << 0x1d |
          (ulong)(SUB164(auVar3 * ZEXT816(0x8888888888888889),8) & 0x1fe0) << 0x23 |
          (ulong)((int)uVar6 + ((uint)(uVar6 / 0x3c) & 0x7ffffff) * 0xc4 & 0xff) << 0x30 |
          (ulong)((uVar10 & 0xff) << 0x10) |
         (ulong)(((int)lVar5 - (SUB164(auVar1 * ZEXT816(0xcccccccccccccccd),8) >> 2)) * 0x1000000));
}

Assistant:

static date_time from_seconds_count(seconds_count seconds)
    {
        const seconds_count days_count = seconds / (24 * 60 * 60);
        const seconds_count z = days_count + 306;
        const seconds_count h = 100 * z - 25;
        const seconds_count a = h / 3652425;
        const seconds_count b = a - a / 4;
        const seconds_count y = static_cast<year_type>((100 * b + h) / 36525);
        const seconds_count c = b + z - 365 * y - y / 4;
        const seconds_count m = (5 * c + 456) / 153;
        const auto day   = static_cast<day_type>(c - (153 * m - 457) / 5);
        const auto month = static_cast<month_type>(m - (m > 12 ? 12 : 0));
        const auto year  = static_cast<year_type>(y + (m > 12 ? 1 : 0));
        auto seconds_rest = seconds - days_count * (24 * 60 * 60);
        const auto hour = static_cast<hour_type>(seconds_rest / (60 * 60));
        seconds_rest -= hour * (60 * 60);
        const auto minute = static_cast<minute_type>(seconds_rest / 60);
        const auto second = static_cast<second_type>(seconds_rest - minute * 60);
        return date_time{ year, month, day, hour, minute, second };
    }